

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjuliancalendar.cpp
# Opt level: O3

YearMonthDay __thiscall QJulianCalendar::julianDayToDate(QJulianCalendar *this,qint64 jd)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  R_conflict20 RVar4;
  YearMonthDay YVar5;
  
  uVar3 = jd * 4 - 0x690c75;
  if ((long)uVar3 < 0) {
    uVar3 = (ulong)(&uleb128_00690c74 + jd * -4) / 0x5b5;
    uVar1 = ~(uint)uVar3;
    uVar3 = (uVar3 * 0x5b5 - (long)(&uleb128_00690c74 + jd * -4)) + 0x5b4;
  }
  else {
    uVar1 = (uint)(uVar3 / 0x5b5);
    uVar3 = uVar3 % 0x5b5;
  }
  RVar4 = QRomanCalendrical::dayInYearToYmd((int)(uVar3 >> 2));
  YVar5.day = RVar4.day;
  iVar2 = uVar1 + RVar4.year;
  YVar5._0_8_ = RVar4._0_8_ & 0xffffffff00000000 | (ulong)(iVar2 - (uint)(iVar2 < 1));
  return YVar5;
}

Assistant:

QCalendar::YearMonthDay QJulianCalendar::julianDayToDate(qint64 jd) const
{
    const auto year4Day = qDivMod<FourYears>(4 * (jd - JulianBaseJd) - 1);
    // Its remainder changes by 4 per day, except at roughly yearly quotient steps.
    const auto ymd = dayInYearToYmd(qDiv<4>(year4Day.remainder));
    const int y = year4Day.quotient + ymd.year;
    return QCalendar::YearMonthDay(y > 0 ? y : y - 1, ymd.month, ymd.day);
}